

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

void __thiscall S2Builder::AddEdge(S2Builder *this,S2Point *v0,S2Point *v1)

{
  bool bVar1;
  DegenerateEdges DVar2;
  int32 iVar3;
  ostream *poVar4;
  reference this_00;
  size_type sVar5;
  pair<int,_int> local_5c;
  InputVertexId local_54;
  InputVertexId local_50;
  InputVertexId j1;
  InputVertexId j0;
  byte local_39;
  S2LogMessage local_38;
  S2LogMessageVoidify local_21;
  S2Point *local_20;
  S2Point *v1_local;
  S2Point *v0_local;
  S2Builder *this_local;
  
  local_20 = v1;
  v1_local = v0;
  v0_local = (S2Point *)this;
  bVar1 = std::
          vector<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
          ::empty(&this->layers_);
  local_39 = 0;
  if (bVar1) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
               ,0x15d,kFatal,(ostream *)&std::cerr);
    local_39 = 1;
    poVar4 = S2LogMessage::stream(&local_38);
    poVar4 = std::operator<<(poVar4,"Check failed: !layers_.empty() ");
    poVar4 = std::operator<<(poVar4,"Call StartLayer before adding any edges");
    S2LogMessageVoidify::operator&(&local_21,poVar4);
  }
  if ((local_39 & 1) == 0) {
    bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                      ((BasicVector<Vector3,_double,_3UL> *)v1_local,local_20);
    if (bVar1) {
      this_00 = std::vector<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>::back
                          (&this->layer_options_);
      DVar2 = GraphOptions::degenerate_edges(this_00);
      if (DVar2 == DISCARD) {
        return;
      }
    }
    local_50 = AddVertex(this,v1_local);
    local_54 = AddVertex(this,local_20);
    std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_5c,&local_50,&local_54);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
              (&this->input_edges_,&local_5c);
    if ((this->label_set_modified_ & 1U) == 0) {
      bVar1 = std::vector<int,_std::allocator<int>_>::empty(&this->label_set_ids_);
      if (!bVar1) {
        std::vector<int,_std::allocator<int>_>::push_back
                  (&this->label_set_ids_,&this->label_set_id_);
      }
    }
    else {
      bVar1 = std::vector<int,_std::allocator<int>_>::empty(&this->label_set_ids_);
      if (bVar1) {
        sVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                          (&this->input_edges_);
        std::vector<int,_std::allocator<int>_>::assign
                  (&this->label_set_ids_,sVar5 - 1,&this->label_set_id_);
      }
      iVar3 = IdSetLexicon::Add<std::vector<int,std::allocator<int>>>
                        (&this->label_set_lexicon_,&this->label_set_);
      this->label_set_id_ = iVar3;
      std::vector<int,_std::allocator<int>_>::push_back(&this->label_set_ids_,&this->label_set_id_);
      this->label_set_modified_ = false;
    }
    return;
  }
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_38);
}

Assistant:

void S2Builder::AddEdge(const S2Point& v0, const S2Point& v1) {
  S2_DCHECK(!layers_.empty()) << "Call StartLayer before adding any edges";

  if (v0 == v1 && (layer_options_.back().degenerate_edges() ==
                   GraphOptions::DegenerateEdges::DISCARD)) {
    return;
  }
  InputVertexId j0 = AddVertex(v0);
  InputVertexId j1 = AddVertex(v1);
  input_edges_.push_back(InputEdge(j0, j1));

  // If there are any labels, then attach them to this input edge.
  if (label_set_modified_) {
    if (label_set_ids_.empty()) {
      // Populate the missing entries with empty label sets.
      label_set_ids_.assign(input_edges_.size() - 1, label_set_id_);
    }
    label_set_id_ = label_set_lexicon_.Add(label_set_);
    label_set_ids_.push_back(label_set_id_);
    label_set_modified_ = false;
  } else if (!label_set_ids_.empty()) {
    label_set_ids_.push_back(label_set_id_);
  }
}